

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

int absl::lts_20250127::log_internal::MaxFramesInLogStackTrace(void)

{
  memory_order __b;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  return (anonymous_namespace)::max_frames_in_stack_trace;
}

Assistant:

int MaxFramesInLogStackTrace() {
  return max_frames_in_stack_trace.load(std::memory_order_acquire);
}